

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::SerialArena::SerialArena
          (SerialArena *this,ArenaBlock *b,ThreadSafeArena *parent)

{
  bool bVar1;
  char *pcVar2;
  LogMessage *pLVar3;
  LogMessage local_38;
  Voidify local_21;
  ThreadSafeArena *local_20;
  ThreadSafeArena *parent_local;
  ArenaBlock *b_local;
  SerialArena *this_local;
  
  local_20 = parent;
  parent_local = (ThreadSafeArena *)b;
  b_local = (ArenaBlock *)this;
  pcVar2 = ArenaBlock::Pointer(b,0x88);
  std::atomic<char_*>::atomic(&this->ptr_,pcVar2);
  pcVar2 = ArenaBlock::Limit((ArenaBlock *)parent_local);
  this->limit_ = pcVar2;
  pcVar2 = ArenaBlock::Pointer((ArenaBlock *)parent_local,0x88);
  this->prefetch_ptr_ = pcVar2;
  cleanup::ChunkList::ChunkList(&this->cleanup_list_);
  std::atomic<google::protobuf::internal::StringBlock_*>::atomic
            (&this->string_block_,(__pointer_type)0x0);
  std::atomic<unsigned_long>::atomic(&this->string_block_unused_,0);
  std::atomic<google::protobuf::internal::ArenaBlock_*>::atomic
            (&this->head_,(__pointer_type)parent_local);
  std::atomic<unsigned_long>::atomic(&this->space_used_,0);
  std::atomic<unsigned_long>::atomic(&this->space_allocated_,(parent_local->alloc_policy_).policy_);
  this->parent_ = local_20;
  this->cached_block_length_ = '\0';
  this->cached_blocks_ = (CachedBlock **)0x0;
  bVar1 = ArenaBlock::IsSentry((ArenaBlock *)parent_local);
  if (!bVar1) {
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
             ,0xcd,"!b->IsSentry()");
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_38);
}

Assistant:

SerialArena::SerialArena(ArenaBlock* b, ThreadSafeArena& parent)
    : ptr_{b->Pointer(kBlockHeaderSize + ThreadSafeArena::kSerialArenaSize)},
      limit_{b->Limit()},
      prefetch_ptr_(
          b->Pointer(kBlockHeaderSize + ThreadSafeArena::kSerialArenaSize)),
      head_{b},
      space_allocated_{b->size},
      parent_{parent} {
  ABSL_DCHECK(!b->IsSentry());
}